

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_constraint.cpp
# Opt level: O1

LogicalIndex __thiscall duckdb::UniqueConstraint::GetIndex(UniqueConstraint *this)

{
  idx_t iVar1;
  InternalException *this_00;
  string local_40;
  
  iVar1 = (this->index).index;
  if (iVar1 != 0xffffffffffffffff) {
    return (LogicalIndex)iVar1;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "UniqueConstraint::GetIndex called on a unique constraint without an index","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool UniqueConstraint::HasIndex() const {
	return index.index != DConstants::INVALID_INDEX;
}